

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O2

string_t __thiscall
duckdb::IntToVarInt<unsigned_long>(duckdb *this,Vector *result,unsigned_long int_value)

{
  long lVar1;
  idx_t extraout_RDX;
  Vector *__x;
  ulong uVar2;
  char *blob_00;
  char **ppcVar3;
  __type_conflict8 _Var4;
  double dVar5;
  string_t blob;
  
  __x = result;
  if (result != (Vector *)0xffffffffffffffff) {
    if (result == (Vector *)0x0) {
      uVar2 = 1;
      goto LAB_017894ca;
    }
    __x = (Vector *)&result->field_0x1;
  }
  _Var4 = ::std::log2<unsigned_long>((unsigned_long)__x);
  dVar5 = ceil(_Var4 * 0.125);
  uVar2 = (ulong)dVar5;
  int_value = extraout_RDX;
LAB_017894ca:
  blob = StringVector::EmptyString((StringVector *)this,(Vector *)(ulong)((int)uVar2 + 3),int_value)
  ;
  blob_00 = blob.value._8_8_;
  if (blob.value._0_4_ < 0xd) {
    blob_00 = blob.value.pointer.prefix;
  }
  Varint::SetHeader(blob_00,uVar2 & 0xffffffff,false);
  lVar1 = (uVar2 & 0xffffffff) * 8;
  ppcVar3 = (char **)(blob_00 + 3);
  while( true ) {
    lVar1 = lVar1 + -8;
    if ((int)uVar2 < 1) break;
    *(char *)ppcVar3 = (char)((ulong)result >> ((byte)lVar1 & 0x3f));
    uVar2 = (ulong)((int)uVar2 - 1);
    ppcVar3 = (char **)((long)ppcVar3 + 1);
  }
  string_t::Finalize(&blob);
  return (string_t)blob.value;
}

Assistant:

string_t IntToVarInt(Vector &result, T int_value) {
	// Determine if the number is negative
	bool is_negative = int_value < 0;
	// Determine the number of data bytes
	uint64_t abs_value;
	if (is_negative) {
		if (int_value == std::numeric_limits<T>::min()) {
			abs_value = static_cast<uint64_t>(std::numeric_limits<T>::max()) + 1;
		} else {
			abs_value = static_cast<uint64_t>(std::abs(static_cast<int64_t>(int_value)));
		}
	} else {
		abs_value = static_cast<uint64_t>(int_value);
	}
	uint32_t data_byte_size;
	if (abs_value != NumericLimits<uint64_t>::Maximum()) {
		data_byte_size = (abs_value == 0) ? 1 : static_cast<uint32_t>(std::ceil(std::log2(abs_value + 1) / 8.0));
	} else {
		data_byte_size = static_cast<uint32_t>(std::ceil(std::log2(abs_value) / 8.0));
	}

	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	auto blob = StringVector::EmptyString(result, blob_size);
	auto writable_blob = blob.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, is_negative);

	// Add data bytes to the blob, starting off after header bytes
	idx_t wb_idx = Varint::VARINT_HEADER_SIZE;
	for (int i = static_cast<int>(data_byte_size) - 1; i >= 0; --i) {
		if (is_negative) {
			writable_blob[wb_idx++] = static_cast<char>(~(abs_value >> i * 8 & 0xFF));
		} else {
			writable_blob[wb_idx++] = static_cast<char>(abs_value >> i * 8 & 0xFF);
		}
	}
	blob.Finalize();
	return blob;
}